

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

void rtcSetSharedGeometryBufferHostDevice
               (RTCGeometry hgeometry,RTCBufferType type,uint slot,RTCFormat format,void *ptr,
               void *dptr,size_t byteOffset,size_t byteStride,size_t itemCount)

{
  undefined8 *puVar1;
  allocator local_59;
  DeviceEnterLeave enterleave;
  string local_50 [32];
  
  if (hgeometry == (RTCGeometry)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_50,"invalid argument",(allocator *)&enterleave);
    *puVar1 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar1 + 1) = 2;
    std::__cxx11::string::string((string *)(puVar1 + 2),local_50);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  embree::DeviceEnterLeave::DeviceEnterLeave(&enterleave,hgeometry);
  if (dptr == (void *)0x0) {
    rtcSetSharedGeometryBuffer(hgeometry,type,slot,format,ptr,byteOffset,byteStride,itemCount);
    embree::DeviceEnterLeave::~DeviceEnterLeave(&enterleave);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            (local_50,
             "Embree device is no SYCL device. Device pointer argument must not be valid, pass NULL instead"
             ,&local_59);
  *puVar1 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar1 + 1) = 2;
  std::__cxx11::string::string((string *)(puVar1 + 2),local_50);
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcSetSharedGeometryBufferHostDevice(RTCGeometry hgeometry, RTCBufferType type, unsigned int slot, RTCFormat format, const void* ptr, const void* dptr, size_t byteOffset, size_t byteStride, size_t itemCount)
  {
    Geometry* geometry = (Geometry*) hgeometry;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcSetSharedGeometryBufferHostDevice);
    RTC_VERIFY_HANDLE(hgeometry);
    RTC_ENTER_DEVICE(hgeometry);

#if defined(EMBREE_SYCL_SUPPORT)
    if (geometry->device->is_gpu())
    {
      if (itemCount > 0xFFFFFFFFu)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"buffer too large");

      if ((ptr == nullptr) || (dptr == nullptr))
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"host and device pointer may not be NULL pointers when using SYCL devices");

      Ref<Buffer> buffer = new Buffer(geometry->device, itemCount*byteStride, (char*)ptr + byteOffset, (char*)dptr + byteOffset);
      geometry->setBuffer(type, slot, format, buffer, 0, byteStride, (unsigned int)itemCount);
    }
    else
#endif
    {
      if (dptr != nullptr)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"Embree device is no SYCL device. Device pointer argument must not be valid, pass NULL instead");
      rtcSetSharedGeometryBuffer(hgeometry, type, slot, format, ptr, byteOffset, byteStride, itemCount);
    }

    RTC_CATCH_END2(geometry);
  }